

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffghprll(fitsfile *fptr,int maxdim,int *simple,int *bitpix,int *naxis,LONGLONG *naxes,
            long *pcount,long *gcount,int *extend,int *status)

{
  double local_70;
  double ddummy;
  LONGLONG lldummy;
  LONGLONG *pLStack_58;
  int idummy;
  LONGLONG *naxes_local;
  int *naxis_local;
  int *bitpix_local;
  int *simple_local;
  fitsfile *pfStack_30;
  int maxdim_local;
  fitsfile *fptr_local;
  
  pLStack_58 = naxes;
  naxes_local = (LONGLONG *)naxis;
  naxis_local = bitpix;
  bitpix_local = simple;
  simple_local._4_4_ = maxdim;
  pfStack_30 = fptr;
  ffgphd(fptr,maxdim,simple,bitpix,naxis,naxes,pcount,gcount,extend,&local_70,&local_70,
         (LONGLONG *)&ddummy,(int *)((long)&lldummy + 4),status);
  return *status;
}

Assistant:

int ffghprll(fitsfile *fptr,  /* I - FITS file pointer                        */
           int maxdim,      /* I - maximum no. of dimensions to read;       */
           int *simple,     /* O - does file conform to FITS standard? 1/0  */
           int *bitpix,     /* O - number of bits per data value pixel      */
           int *naxis,      /* O - number of axes in the data array         */
           LONGLONG naxes[],    /* O - length of each data axis                 */
           long *pcount,    /* O - number of group parameters (usually 0)   */
           long *gcount,    /* O - number of random groups (usually 1 or 0) */
           int *extend,     /* O - may FITS file haave extensions?          */
           int *status)     /* IO - error status                            */
/*
  Get keywords from the Header of the PRimary array:
  Check that the keywords conform to the FITS standard and return the
  parameters which determine the size and structure of the primary array
  or IMAGE extension.
*/
{
    int idummy;
    LONGLONG lldummy;
    double ddummy;

    ffgphd(fptr, maxdim, simple, bitpix, naxis, naxes, pcount, gcount, extend,
          &ddummy, &ddummy, &lldummy, &idummy, status);

    return(*status);
}